

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O2

string * amrex::trim(string *__return_storage_ptr__,string *s,string *space)

{
  long lVar1;
  string local_40 [32];
  
  lVar1 = std::__cxx11::string::find_first_not_of((string *)s,(ulong)space);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::find_last_not_of((string *)s,(ulong)space);
    std::__cxx11::string::substr((ulong)local_40,(ulong)s);
    std::__cxx11::string::operator=((string *)s,local_40);
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
amrex::trim(std::string s, std::string const& space)
{
    const auto sbegin = s.find_first_not_of(space);
    if (sbegin == std::string::npos) return std::string{};
    const auto send = s.find_last_not_of(space);
    s = s.substr(sbegin, send-sbegin+1);
    return s;
}